

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O0

int solveTasks(char *filename)

{
  int iVar1;
  HDual solver;
  int RtCd;
  HModel model;
  undefined4 in_stack_fffffffffffea330;
  HModel aHStack_15cc8 [88];
  HDual *in_stack_fffffffffffea390;
  undefined4 local_11a0 [4];
  undefined4 local_1190;
  int local_4;
  
  HModel::HModel((HModel *)local_11a0);
  local_11a0[0] = 1;
  local_1190 = 1;
  iVar1 = HModel::load_fromMPS((char *)local_11a0);
  local_4 = iVar1;
  if (iVar1 == 0) {
    HModel::scaleModel();
    HDual::HDual(in_stack_fffffffffffea390);
    HDual::solve(aHStack_15cc8,(int)local_11a0,1);
    HModel::util_reportSolverOutcome((char *)local_11a0);
    HModel::writePivots((char *)local_11a0);
    local_4 = 0;
    HDual::~HDual(in_stack_fffffffffffea390);
  }
  HModel::~HModel((HModel *)CONCAT44(iVar1,in_stack_fffffffffffea330));
  return local_4;
}

Assistant:

int solveTasks(const char *filename) {
    HModel model;
    model.intOption[INTOPT_PRINT_FLAG] = 1;
    model.intOption[INTOPT_PERMUTE_FLAG] = 1;
    int RtCd = model.load_fromMPS(filename);
    if (RtCd) return RtCd;

    model.scaleModel();
    HDual solver;
    solver.solve(&model, HDUAL_VARIANT_TASKS, 8);

    model.util_reportSolverOutcome("Solve tasks");
#ifdef JAJH_dev
    model.writePivots("tasks");
#endif
    return 0;
}